

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctstr_ieq(char *s1,char *s2)

{
  int iVar1;
  __int32_t **pp_Var2;
  long lVar3;
  
  if (s1 == s2) {
LAB_001031e0:
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if ((s1 != (char *)0x0 || s2 == (char *)0x0) && (s1 == (char *)0x0 || s2 != (char *)0x0)) {
      pp_Var2 = __ctype_tolower_loc();
      iVar1 = 0;
      lVar3 = 0;
      while ((*pp_Var2)[s1[lVar3]] == (*pp_Var2)[s2[lVar3]]) {
        if (s1[lVar3] == '\0') goto LAB_001031e0;
        lVar3 = lVar3 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
fctstr_ieq(char const *s1, char const *s2)
{
    if ( s1 == s2 )
    {
        return 1;
    }
    if ( (s1 == NULL && s2 != NULL)
            || (s1 != NULL && s2 == NULL) )
    {
        return 0;
    }
    while (tolower(*s1) == tolower(*s2))
    {
        if (*s1 == '\0')
            return 1;
        s1++;
        s2++;
    }
    /* Difference detected! */
    return 0;
}